

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::TrackAddPropertyTypes(BackwardPass *this,PropertySymOpnd *opnd,BasicBlock *block)

{
  BVIndex i;
  Sym *pSVar1;
  code *pcVar2;
  BasicBlock *pBVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  AddPropertyCacheBucket *pAVar10;
  JITType *pJVar11;
  JITTypeHandler *pJVar12;
  JITTypeHandler *pJVar13;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *pHVar14;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  JITTimeFunctionBody *pJVar15;
  FunctionJITTimeInfo *pFVar16;
  JITTypeHolderBase<void> *pJVar17;
  JITTypeHolderBase<void> local_98;
  JITTypeHolderBase<void> local_90;
  JITTypeHolderBase<void> local_88;
  JITTypeHolderBase<void> local_80;
  Sym *local_78;
  JITTypeHandler *local_70;
  JITTypeHolderBase<void> local_68;
  BasicBlock *local_60;
  JITTypeHolderBase<void> local_58;
  JITTypeHolder deadStoreUnavailableFinalType;
  JITTypeHolderBase<void> local_48;
  JITTypeHolder typeWithoutProperty;
  JITTypeHolder finalType;
  JITTypeHolder checkFinalType;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1691,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase"
                      );
    if (!bVar4) goto LAB_003eca7c;
    *puVar9 = 0;
  }
  if (((opnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
      (bVar4 = ObjTypeSpecFldInfo::IsMono(opnd->objTypeSpecFldInfo), !bVar4)) &&
     ((opnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0 ||
      (bVar4 = ObjTypeSpecFldInfo::HasEquivalentTypeSet(opnd->objTypeSpecFldInfo), !bVar4)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1692,"(opnd->IsMono() || opnd->HasEquivalentTypeSet())",
                       "opnd->IsMono() || opnd->HasEquivalentTypeSet()");
    if (!bVar4) goto LAB_003eca7c;
    *puVar9 = 0;
  }
  if ((opnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
     (bVar4 = ObjTypeSpecFldInfo::IsMono(opnd->objTypeSpecFldInfo), !bVar4)) {
    local_68.t = (Type)IR::PropertySymOpnd::GetFirstEquivalentType(opnd);
  }
  else {
    local_68.t = (Type)IR::PropertySymOpnd::GetType(opnd);
  }
  bVar4 = IR::PropertySymOpnd::HasInitialType(opnd);
  if (bVar4) {
    local_48.t = (Type)IR::PropertySymOpnd::GetInitialType(opnd);
  }
  else {
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_48,(JITType *)0x0);
  }
  typeWithoutProperty.t = (Type)0x0;
  bVar4 = JITTypeHolderBase<void>::operator==(&local_48,&typeWithoutProperty.t);
  if (((bVar4) || (bVar4 = JITTypeHolderBase<void>::operator==(&local_68,&local_48), bVar4)) ||
     ((((opnd->field_12).objTypeSpecFlags & 0x800) != 0 &&
      (((opnd->field_12).objTypeSpecFlags & 0x1000) == 0)))) {
    if (((this->currentPrePassLoop == (Loop *)0x0) &&
        (block->stackSymToFinalType !=
         (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0)) &&
       ((this->currentInstr->field_0x38 & 0x10) == 0)) {
      pSVar1 = (opnd->super_SymOpnd).m_sym;
      if (pSVar1->m_kind != SymKindProperty) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
        if (!bVar4) goto LAB_003eca7c;
        *puVar9 = 0;
      }
      pAVar10 = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::Get
                          (block->stackSymToFinalType,(pSVar1[1].m_next)->m_id);
      if (pAVar10 != (AddPropertyCacheBucket *)0x0) {
        typeWithoutProperty.t = (pAVar10->finalType).t;
        local_58.t = (Type)0x0;
        bVar4 = JITTypeHolderBase<void>::operator!=(&typeWithoutProperty,&local_58.t);
        if (bVar4) {
          finalType.t = (pAVar10->initialType).t;
          deadStoreUnavailableFinalType.t = (pAVar10->finalType).t;
          bVar4 = JITTypeHolderBase<void>::operator!=(&finalType,&deadStoreUnavailableFinalType);
          if (bVar4) {
            IR::PropertySymOpnd::SetFinalType(opnd,(pAVar10->finalType).t);
          }
        }
      }
    }
    return;
  }
  typeWithoutProperty.t = (Type)0x0;
  bVar4 = JITTypeHolderBase<void>::operator!=(&local_68,&typeWithoutProperty.t);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x16aa,"(typeWithProperty != nullptr)","typeWithProperty != nullptr");
    if (!bVar4) goto LAB_003eca7c;
    *puVar9 = 0;
  }
  local_60 = block;
  pJVar11 = JITTypeHolderBase<void>::operator->(&local_48);
  pJVar12 = JITType::GetTypeHandler(pJVar11);
  pJVar11 = JITTypeHolderBase<void>::operator->(&local_68);
  pJVar13 = JITType::GetTypeHandler(pJVar11);
  bVar4 = JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(pJVar12,pJVar13);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x16b0,
                       "(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(typeWithoutPropertyTypeHandler, typeWithPropertyTypeHandler))"
                       ,"TypeHandlers are not compatible for transition?");
    if (!bVar4) goto LAB_003eca7c;
    *puVar9 = 0;
  }
  iVar5 = JITTypeHandler::GetSlotCapacity(pJVar12);
  iVar6 = JITTypeHandler::GetSlotCapacity(pJVar13);
  pBVar3 = local_60;
  if (iVar6 < iVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x16b1,
                       "(typeWithoutPropertyTypeHandler->GetSlotCapacity() <= typeWithPropertyTypeHandler->GetSlotCapacity())"
                       ,
                       "typeWithoutPropertyTypeHandler->GetSlotCapacity() <= typeWithPropertyTypeHandler->GetSlotCapacity()"
                      );
    if (!bVar4) goto LAB_003eca7c;
    *puVar9 = 0;
  }
  if (pBVar3->stackSymToFinalType ==
      (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0) {
    pHVar14 = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::New
                        (&this->tempAlloc->super_ArenaAllocator,8);
    pBVar3->stackSymToFinalType = pHVar14;
  }
  pSVar1 = (opnd->super_SymOpnd).m_sym;
  if (pSVar1->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar4) goto LAB_003eca7c;
    *puVar9 = 0;
  }
  pAVar10 = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::FindOrInsertNew
                      (pBVar3->stackSymToFinalType,(pSVar1[1].m_next)->m_id);
  JITTypeHolderBase<void>::JITTypeHolderBase(&typeWithoutProperty,(JITType *)0x0);
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_58,(JITType *)0x0);
  finalType.t = (pAVar10->initialType).t;
  deadStoreUnavailableFinalType.t = (Type)0x0;
  bVar4 = JITTypeHolderBase<void>::operator==(&finalType,&deadStoreUnavailableFinalType.t);
  if (bVar4) {
LAB_003ec6d3:
    finalType = IR::PropertySymOpnd::GetType(opnd);
    bVar4 = JITTypeHolderBase<void>::operator==
                      (&finalType,&pAVar10->deadStoreUnavailableInitialType);
    if (bVar4) {
      local_58.t = (pAVar10->deadStoreUnavailableFinalType).t;
    }
    typeWithoutProperty = IR::PropertySymOpnd::GetType(opnd);
    (pAVar10->finalType).t = typeWithoutProperty.t;
  }
  else {
    local_98.t = (Type)IR::PropertySymOpnd::GetType(opnd);
    local_90.t = (pAVar10->initialType).t;
    bVar4 = JITTypeHolderBase<void>::operator!=(&local_98,&local_90);
    if (bVar4) goto LAB_003ec6d3;
    typeWithoutProperty.t = (pAVar10->finalType).t;
    local_58.t = (pAVar10->deadStoreUnavailableFinalType).t;
  }
  (pAVar10->initialType).t = local_48.t;
  i = (pSVar1[1].m_next)->m_id;
  local_78 = pSVar1;
  this_00 = BasicBlock::EnsureTypeIDsWithFinalType(local_60,this->tempAlloc);
  BVSparse<Memory::JitArenaAllocator>::Set(this_00,i);
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
  pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,ObjTypeSpecStorePhase,uVar7,uVar8);
  if (!bVar4) {
    if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 4) == 0) {
      deadStoreUnavailableFinalType.t = (Type)0x0;
      bVar4 = JITTypeHolderBase<void>::operator!=(&local_58,&deadStoreUnavailableFinalType.t);
      pJVar17 = &typeWithoutProperty;
      if (bVar4) {
        pJVar17 = &local_58;
      }
      finalType.t = pJVar17->t;
      bVar4 = IR::PropertySymOpnd::HasFinalType(opnd);
      if (bVar4) {
        deadStoreUnavailableFinalType.t = (opnd->finalType).t;
        bVar4 = JITTypeHolderBase<void>::operator!=(&deadStoreUnavailableFinalType,&finalType);
        if (bVar4) {
          deadStoreUnavailableFinalType.t = (opnd->finalType).t;
          pJVar11 = JITTypeHolderBase<void>::operator->(&deadStoreUnavailableFinalType);
          pJVar12 = JITType::GetTypeHandler(pJVar11);
          pJVar11 = JITTypeHolderBase<void>::operator->(&finalType);
          pJVar13 = JITType::GetTypeHandler(pJVar11);
          bVar4 = JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(pJVar12,pJVar13);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            local_70 = pJVar12;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar9 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x16ff,
                               "(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(oldFinalTypeHandler, checkFinalTypeHandler))"
                               ,"TypeHandlers should be compatible for transition.");
            if (!bVar4) goto LAB_003eca7c;
            *puVar9 = 0;
            pJVar12 = local_70;
          }
          iVar5 = JITTypeHandler::GetSlotCapacity(pJVar12);
          iVar6 = JITTypeHandler::GetSlotCapacity(pJVar13);
          if (iVar6 < iVar5) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar9 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1700,
                               "(oldFinalTypeHandler->GetSlotCapacity() <= checkFinalTypeHandler->GetSlotCapacity())"
                               ,
                               "oldFinalTypeHandler->GetSlotCapacity() <= checkFinalTypeHandler->GetSlotCapacity()"
                              );
            if (!bVar4) goto LAB_003eca7c;
            *puVar9 = 0;
          }
        }
      }
    }
    if ((opnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
       (bVar4 = ObjTypeSpecFldInfo::IsBeingAdded(opnd->objTypeSpecFldInfo), !bVar4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1704,"(opnd->IsBeingAdded())","opnd->IsBeingAdded()");
      if (!bVar4) {
LAB_003eca7c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    if (this->currentPrePassLoop == (Loop *)0x0) {
      IR::PropertySymOpnd::SetFinalType(opnd,typeWithoutProperty);
    }
    if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 10) == 2) {
      (pAVar10->finalType).t = (pAVar10->initialType).t;
    }
  }
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
  pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,ObjTypeSpecStorePhase,uVar7,uVar8);
  if (bVar4) {
    Output::Print(L"ObjTypeSpecStore: ");
    IR::Instr::Dump(this->currentInstr);
    AddPropertyCacheBucket::Dump(pAVar10);
  }
  pBVar3 = local_60;
  if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 2) != 0) {
    return;
  }
  (pAVar10->deadStoreUnavailableInitialType).t = (pAVar10->initialType).t;
  finalType.t = (Type)0x0;
  bVar4 = JITTypeHolderBase<void>::operator==(&pAVar10->deadStoreUnavailableFinalType,&finalType.t);
  if (bVar4) {
    (pAVar10->deadStoreUnavailableFinalType).t = (pAVar10->finalType).t;
  }
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_88,(JITType *)0x0);
  (pAVar10->initialType).t = local_88.t;
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_80,(JITType *)0x0);
  (pAVar10->finalType).t = local_80.t;
  if (pBVar3->typeIDsWithFinalType == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    return;
  }
  BVSparse<Memory::JitArenaAllocator>::Clear
            (pBVar3->typeIDsWithFinalType,(local_78[1].m_next)->m_id);
  return;
}

Assistant:

void
BackwardPass::TrackAddPropertyTypes(IR::PropertySymOpnd *opnd, BasicBlock *block)
{
    // Do the work of objtypespec add-property opt even if it's disabled by PHASE option, so that we have
    // the dataflow info that can be inspected.

    Assert(this->tag == Js::DeadStorePhase);
    Assert(opnd->IsMono() || opnd->HasEquivalentTypeSet());

    JITTypeHolder typeWithProperty = opnd->IsMono() ? opnd->GetType() : opnd->GetFirstEquivalentType();
    JITTypeHolder typeWithoutProperty = opnd->HasInitialType() ? opnd->GetInitialType() : JITTypeHolder(nullptr);

    if (typeWithoutProperty == nullptr ||
        typeWithProperty == typeWithoutProperty ||
        (opnd->IsTypeChecked() && !opnd->IsInitialTypeChecked()))
    {
        if (!this->IsPrePass() && block->stackSymToFinalType != nullptr && !this->currentInstr->HasBailOutInfo())
        {
            PropertySym *propertySym = opnd->m_sym->AsPropertySym();
            AddPropertyCacheBucket *pBucket =
                block->stackSymToFinalType->Get(propertySym->m_stackSym->m_id);
            if (pBucket && pBucket->GetFinalType() != nullptr && pBucket->GetInitialType() != pBucket->GetFinalType())
            {
                opnd->SetFinalType(pBucket->GetFinalType());
            }
        }

        return;
    }

#if DBG
    Assert(typeWithProperty != nullptr);
    const JITTypeHandler * typeWithoutPropertyTypeHandler = typeWithoutProperty->GetTypeHandler();
    const JITTypeHandler * typeWithPropertyTypeHandler = typeWithProperty->GetTypeHandler();
    // TODO: OOP JIT, reenable assert
    //Assert(typeWithoutPropertyTypeHandler->GetPropertyCount() + 1 == typeWithPropertyTypeHandler->GetPropertyCount());
    AssertMsg(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(typeWithoutPropertyTypeHandler, typeWithPropertyTypeHandler),
        "TypeHandlers are not compatible for transition?");
    Assert(typeWithoutPropertyTypeHandler->GetSlotCapacity() <= typeWithPropertyTypeHandler->GetSlotCapacity());
#endif

    // If there's already a final type for this instance, record it on the operand.
    // If not, start tracking it.
    if (block->stackSymToFinalType == nullptr)
    {
        block->stackSymToFinalType = HashTable<AddPropertyCacheBucket>::New(this->tempAlloc, 8);
    }

    // Find or create the type-tracking record for this instance in this block.
    PropertySym *propertySym = opnd->m_sym->AsPropertySym();
    AddPropertyCacheBucket *pBucket =
        block->stackSymToFinalType->FindOrInsertNew(propertySym->m_stackSym->m_id);

    JITTypeHolder finalType(nullptr);
#if DBG
    JITTypeHolder deadStoreUnavailableFinalType(nullptr);
#endif
    if (pBucket->GetInitialType() == nullptr || opnd->GetType() != pBucket->GetInitialType())
    {
#if DBG
        if (opnd->GetType() == pBucket->deadStoreUnavailableInitialType)
        {
            deadStoreUnavailableFinalType = pBucket->deadStoreUnavailableFinalType;
        }
#endif
        // No info found, or the info was bad, so initialize it from this cache.
        finalType = opnd->GetType();
        pBucket->SetFinalType(finalType);
    }
    else
    {
        // Match: The type we push upward is now the typeWithoutProperty at this point,
        // and the final type is the one we've been tracking.
        finalType = pBucket->GetFinalType();
#if DBG
        deadStoreUnavailableFinalType = pBucket->deadStoreUnavailableFinalType;
#endif
    }

    pBucket->SetInitialType(typeWithoutProperty);
    this->SetTypeIDWithFinalType(propertySym->m_stackSym->m_id, block);

    if (!PHASE_OFF(Js::ObjTypeSpecStorePhase, this->func))
    {
#if DBG

        // We may regress in this case:
        // if (b)
        //      t1 = {};
        //      o = t1;
        //      o.x =
        // else
        //      t2 = {};
        //      o = t2;
        //      o.x =
        // o.y =
        //
        // Where the backward pass will propagate the final type in o.y to o.x, then globopt will copy prop t1 and t2 to o.x.
        // But not o.y (because of the merge).  Then, in the dead store pass, o.y's final type will not propagate to t1.x and t2.x
        // respectively, thus regression the final type.  However, in both cases, the types of t1 and t2 are dead anyways.
        //
        // if the type is dead, we don't care if we have regressed the type, as no one is depending on it to skip type check anyways
        if (!opnd->IsTypeDead())
        {
            // This is the type that would have been propagated if we didn't kill it because the type isn't available
            JITTypeHolder checkFinalType = deadStoreUnavailableFinalType != nullptr ? deadStoreUnavailableFinalType : finalType;
            if (opnd->HasFinalType() && opnd->GetFinalType() != checkFinalType)
            {
                // Final type discovery must be progressively better (unless we kill it in the deadstore pass
                // when the type is not available during the forward pass)
                const JITTypeHandler * oldFinalTypeHandler = opnd->GetFinalType()->GetTypeHandler();
                const JITTypeHandler * checkFinalTypeHandler = checkFinalType->GetTypeHandler();

                // TODO: OOP JIT, enable assert
                //Assert(oldFinalTypeHandler->GetPropertyCount() < checkFinalTypeHandler->GetPropertyCount());
                AssertMsg(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(oldFinalTypeHandler, checkFinalTypeHandler),
                    "TypeHandlers should be compatible for transition.");
                Assert(oldFinalTypeHandler->GetSlotCapacity() <= checkFinalTypeHandler->GetSlotCapacity());
            }
        }
#endif
        Assert(opnd->IsBeingAdded());
        if (!this->IsPrePass())
        {
            opnd->SetFinalType(finalType);
        }
        if (!opnd->IsTypeChecked())
        {
            // Transition from initial to final type will only happen at type check points.
            if (opnd->IsTypeAvailable())
            {
                pBucket->SetFinalType(pBucket->GetInitialType());
            }
        }
    }

#if DBG_DUMP
    if (PHASE_TRACE(Js::ObjTypeSpecStorePhase, this->func))
    {
        Output::Print(_u("ObjTypeSpecStore: "));
        this->currentInstr->Dump();
        pBucket->Dump();
    }
#endif

    // In the dead-store pass, we have forward information that tells us whether a "final type"
    // reached this point from an earlier store. If it didn't (i.e., it's not available here),
    // remove it from the backward map so that upstream stores will use the final type that is
    // live there. (This avoids unnecessary bailouts in cases where the final type is only live
    // on one branch of an "if", a case that the initial backward pass can't detect.)
    // An example:
    //  if (cond)
    //      o.x =
    //  o.y =

    if (!opnd->IsTypeAvailable())
    {
#if DBG
        pBucket->deadStoreUnavailableInitialType = pBucket->GetInitialType();
        if (pBucket->deadStoreUnavailableFinalType == nullptr)
        {
            pBucket->deadStoreUnavailableFinalType = pBucket->GetFinalType();
        }
        pBucket->SetInitialType(nullptr);
        pBucket->SetFinalType(nullptr);
#else
        block->stackSymToFinalType->Clear(propertySym->m_stackSym->m_id);
#endif
        this->ClearTypeIDWithFinalType(propertySym->m_stackSym->m_id, block);
    }
}